

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O0

void compare_functions(vector<t_function_*,_std::allocator<t_function_*>_> *newFunctionList,
                      vector<t_function_*,_std::allocator<t_function_*>_> *oldFunctionList)

{
  t_function *this;
  bool bVar1;
  mapped_type *pptVar2;
  reference pptVar3;
  string *psVar4;
  undefined8 uVar5;
  pointer ppVar6;
  _Self local_b0;
  _Base_ptr local_a8;
  t_function *local_a0;
  t_function *oldFunctionIt;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<t_function_*,_std::allocator<t_function_*>_> *__range1_1;
  t_function *newFunctionIt;
  const_iterator __end1;
  const_iterator __begin1;
  vector<t_function_*,_std::allocator<t_function_*>_> *__range1;
  iterator newFunctionMapIt;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
  newFunctionMap;
  vector<t_function_*,_std::allocator<t_function_*>_> *oldFunctionList_local;
  vector<t_function_*,_std::allocator<t_function_*>_> *newFunctionList_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
         *)&newFunctionMapIt);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>
                       *)&__range1);
  __end1 = std::vector<t_function_*,_std::allocator<t_function_*>_>::begin(newFunctionList);
  newFunctionIt =
       (t_function *)std::vector<t_function_*,_std::allocator<t_function_*>_>::end(newFunctionList);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                                *)&newFunctionIt);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&__end1);
    this = *pptVar3;
    psVar4 = t_function::get_name_abi_cxx11_(this);
    pptVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
                            *)&newFunctionMapIt,psVar4);
    *pptVar2 = this;
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<t_function_*,_std::allocator<t_function_*>_>::begin(oldFunctionList);
  oldFunctionIt =
       (t_function *)std::vector<t_function_*,_std::allocator<t_function_*>_>::end(oldFunctionList);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&oldFunctionIt);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&__end1_1);
    local_a0 = *pptVar3;
    psVar4 = t_function::get_name_abi_cxx11_(local_a0);
    local_a8 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
                       *)&newFunctionMapIt,psVar4);
    __range1 = (vector<t_function_*,_std::allocator<t_function_*>_> *)local_a8;
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
                *)&newFunctionMapIt);
    bVar1 = std::operator==((_Self *)&__range1,&local_b0);
    if (bVar1) {
      t_function::get_name_abi_cxx11_(local_a0);
      uVar5 = std::__cxx11::string::c_str();
      thrift_audit_failure("New Thrift File has missing function %s\n",uVar5);
    }
    else {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>
                             *)&__range1);
      compare_single_function(ppVar6->second,local_a0);
    }
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&__end1_1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_function_*>_>_>
          *)&newFunctionMapIt);
  return;
}

Assistant:

void compare_functions(const std::vector<t_function*>& newFunctionList, const std::vector<t_function*>& oldFunctionList)
{
   std::map<std::string, t_function*> newFunctionMap;
   std::map<std::string, t_function*>::iterator newFunctionMapIt;
   for(auto newFunctionIt : newFunctionList)
   {
      newFunctionMap[newFunctionIt->get_name()] = newFunctionIt;
   }

   for(auto oldFunctionIt : oldFunctionList)
   {
      newFunctionMapIt = newFunctionMap.find(oldFunctionIt->get_name());
      if(newFunctionMapIt == newFunctionMap.end())
      {
         thrift_audit_failure("New Thrift File has missing function %s\n",oldFunctionIt->get_name().c_str());
         continue;
      }
      else
      {
         //Function is found in both thrift files. Compare return type and argument list
         compare_single_function(newFunctionMapIt->second, oldFunctionIt);
      }
   }

}